

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigSwitch.c
# Opt level: O2

void Aig_CManStoreNum(Aig_CMan_t *p,uint x)

{
  byte *pbVar1;
  
  for (; 0x7f < x; x = x >> 7) {
    pbVar1 = p->pCur;
    p->pCur = pbVar1 + 1;
    *pbVar1 = (byte)x | 0x80;
  }
  pbVar1 = p->pCur;
  p->pCur = pbVar1 + 1;
  *pbVar1 = (byte)x;
  if ((long)(p->pCur + (-0x28 - (long)p)) < (long)p->nBytes + -10) {
    return;
  }
  __assert_fail("p->pCur - p->Data < p->nBytes - 10",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/saig/saigSwitch.c"
                ,0x1b1,"void Aig_CManStoreNum(Aig_CMan_t *, unsigned int)");
}

Assistant:

void Aig_CManStoreNum( Aig_CMan_t * p, unsigned x )
{
    while ( x & ~0x7f )
    {
        *p->pCur++ = (x & 0x7f) | 0x80;
        x >>= 7;
    }
    *p->pCur++ = x;
    assert( p->pCur - p->Data < p->nBytes - 10 );
}